

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

void helper_pre_smc_arm(CPUARMState *env,uint32_t syndrome)

{
  ulong uVar1;
  byte bVar2;
  _Bool _Var3;
  uint uVar4;
  uint32_t target_el;
  uint64_t uVar5;
  uint uVar6;
  byte bVar7;
  
  uVar1 = env->features;
  uVar4 = (uint)uVar1;
  if ((uVar4 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar6 = env->uncached_cpsr & 0x1f;
      if (uVar6 == 0x10) {
        uVar6 = 0;
      }
      else if (uVar6 == 0x16) {
LAB_00598950:
        uVar6 = 3;
      }
      else if (uVar6 == 0x1a) {
        uVar6 = 2;
      }
      else {
        if ((uVar1 & 0x200000000) != 0) {
          if (uVar6 == 0x16) {
            uVar6 = 3;
            if ((uVar4 >> 0x1c & 1) == 0) goto LAB_00598955;
          }
          else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) goto LAB_00598950;
        }
        uVar6 = 1;
      }
    }
    else {
      uVar6 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar6 = 1;
    if ((env->v7m).exception == 0) {
      uVar6 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_00598955:
  bVar7 = 1;
  if ((uVar1 & 0x200000000) == 0) goto LAB_0059898d;
  if (env->aarch64 == 0) {
    if ((env->uncached_cpsr & 0x1f) != 0x16) goto LAB_00598984;
  }
  else if ((~env->pstate & 0xc) != 0) {
LAB_00598984:
    bVar7 = (byte)(env->cp15).scr_el3 & 1;
    goto LAB_0059898d;
  }
  bVar7 = 0;
LAB_0059898d:
  bVar2 = (byte)(env->cp15).scr_el3 >> 7;
  bVar7 = bVar7 & bVar2;
  if ((uVar4 >> 0x1c & 1) != 0) {
    bVar7 = bVar2;
  }
  if (((uVar1 & 0x200000000) != 0) || (*(int *)((long)env[1].xregs + 0x24) == 1)) {
    if ((uVar6 == 1) && (uVar5 = arm_hcr_el2_eff_arm(env), ((uint)uVar5 >> 0x13 & 1) != 0)) {
      raise_exception_arm(env,0xc,syndrome,2);
    }
    _Var3 = arm_is_psci_call_arm((ARMCPU *)(env[-10].cp15.c14_pmevcntr + 0x1b),0xd);
    if ((_Var3) || ((bVar7 == 0 && ((env->features & 0x200000000) != 0)))) {
      return;
    }
  }
  target_el = exception_target_el(env);
  raise_exception_arm(env,1,0x2000000,target_el);
}

Assistant:

void HELPER(pre_smc)(CPUARMState *env, uint32_t syndrome)
{
    ARMCPU *cpu = env_archcpu(env);
    int cur_el = arm_current_el(env);
    bool secure = arm_is_secure(env);
    bool smd_flag = env->cp15.scr_el3 & SCR_SMD;

    /*
     * SMC behaviour is summarized in the following table.
     * This helper handles the "Trap to EL2" and "Undef insn" cases.
     * The "Trap to EL3" and "PSCI call" cases are handled in the exception
     * helper.
     *
     *  -> ARM_FEATURE_EL3 and !SMD
     *                           HCR_TSC && NS EL1   !HCR_TSC || !NS EL1
     *
     *  Conduit SMC, valid call  Trap to EL2         PSCI Call
     *  Conduit SMC, inval call  Trap to EL2         Trap to EL3
     *  Conduit not SMC          Trap to EL2         Trap to EL3
     *
     *
     *  -> ARM_FEATURE_EL3 and SMD
     *                           HCR_TSC && NS EL1   !HCR_TSC || !NS EL1
     *
     *  Conduit SMC, valid call  Trap to EL2         PSCI Call
     *  Conduit SMC, inval call  Trap to EL2         Undef insn
     *  Conduit not SMC          Trap to EL2         Undef insn
     *
     *
     *  -> !ARM_FEATURE_EL3
     *                           HCR_TSC && NS EL1   !HCR_TSC || !NS EL1
     *
     *  Conduit SMC, valid call  Trap to EL2         PSCI Call
     *  Conduit SMC, inval call  Trap to EL2         Undef insn
     *  Conduit not SMC          Undef insn          Undef insn
     */

    /* On ARMv8 with EL3 AArch64, SMD applies to both S and NS state.
     * On ARMv8 with EL3 AArch32, or ARMv7 with the Virtualization
     *  extensions, SMD only applies to NS state.
     * On ARMv7 without the Virtualization extensions, the SMD bit
     * doesn't exist, but we forbid the guest to set it to 1 in scr_write(),
     * so we need not special case this here.
     */
    bool smd = arm_feature(env, ARM_FEATURE_AARCH64) ? smd_flag
                                                     : smd_flag && !secure;

    if (!arm_feature(env, ARM_FEATURE_EL3) &&
        cpu->psci_conduit != QEMU_PSCI_CONDUIT_SMC) {
        /* If we have no EL3 then SMC always UNDEFs and can't be
         * trapped to EL2. PSCI-via-SMC is a sort of ersatz EL3
         * firmware within QEMU, and we want an EL2 guest to be able
         * to forbid its EL1 from making PSCI calls into QEMU's
         * "firmware" via HCR.TSC, so for these purposes treat
         * PSCI-via-SMC as implying an EL3.
         * This handles the very last line of the previous table.
         */
        raise_exception(env, EXCP_UDEF, syn_uncategorized(),
                        exception_target_el(env));
    }

    if (cur_el == 1 && (arm_hcr_el2_eff(env) & HCR_TSC)) {
        /* In NS EL1, HCR controlled routing to EL2 has priority over SMD.
         * We also want an EL2 guest to be able to forbid its EL1 from
         * making PSCI calls into QEMU's "firmware" via HCR.TSC.
         * This handles all the "Trap to EL2" cases of the previous table.
         */
        raise_exception(env, EXCP_HYP_TRAP, syndrome, 2);
    }

    /* Catch the two remaining "Undef insn" cases of the previous table:
     *    - PSCI conduit is SMC but we don't have a valid PCSI call,
     *    - We don't have EL3 or SMD is set.
     */
    if (!arm_is_psci_call(cpu, EXCP_SMC) &&
        (smd || !arm_feature(env, ARM_FEATURE_EL3))) {
        raise_exception(env, EXCP_UDEF, syn_uncategorized(),
                        exception_target_el(env));
    }
}